

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsTextItem::focusInEvent(QGraphicsTextItem *this,QFocusEvent *event)

{
  int iVar1;
  long in_FS_OFFSET;
  QRectF local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QGraphicsTextItemPrivate::sendControlEvent
            (*(QGraphicsTextItemPrivate **)(this + 0x20),(QEvent *)event);
  iVar1 = QFocusEvent::reason();
  if (iVar1 == 0) {
    *(byte *)(*(long *)(this + 0x20) + 0x2e) = *(byte *)(*(long *)(this + 0x20) + 0x2e) | 1;
  }
  local_38.w = 0.0;
  local_38.h = 0.0;
  local_38.xp = 0.0;
  local_38.yp = 0.0;
  QGraphicsItem::update((QGraphicsItem *)(this + 0x10),&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::focusInEvent(QFocusEvent *event)
{
    dd->sendControlEvent(event);
    if (event->reason() == Qt::MouseFocusReason) {
        dd->clickCausedFocus = 1;
    }
    update();
}